

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_manager.cpp
# Opt level: O1

void __thiscall duckdb::BlockManager::UnregisterBlock(BlockManager *this,block_id_t id)

{
  int iVar1;
  block_id_t local_18;
  
  local_18 = id;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->blocks_lock);
  if (iVar1 == 0) {
    ::std::
    _Hashtable<long,_std::pair<const_long,_duckdb::weak_ptr<duckdb::BlockHandle,_true>_>,_std::allocator<std::pair<const_long,_duckdb::weak_ptr<duckdb::BlockHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_M_erase(&(this->blocks)._M_h,&local_18);
    pthread_mutex_unlock((pthread_mutex_t *)&this->blocks_lock);
    return;
  }
  ::std::__throw_system_error(iVar1);
}

Assistant:

void BlockManager::UnregisterBlock(block_id_t id) {
	D_ASSERT(id < MAXIMUM_BLOCK);
	lock_guard<mutex> lock(blocks_lock);
	// on-disk block: erase from list of blocks in manager
	blocks.erase(id);
}